

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O2

void __thiscall Assimp::STLExporter::WritePointCloud(STLExporter *this,string *name,aiScene *pScene)

{
  string *psVar1;
  aiMesh *paVar2;
  aiVector3D *paVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  poVar4 = std::operator<<((ostream *)this," ");
  poVar4 = std::operator<<(poVar4,"solid");
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)name);
  psVar1 = &this->endl;
  std::operator<<(poVar4,(string *)psVar1);
  poVar4 = std::operator<<((ostream *)this," facet normal ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0.0);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0.0);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0.0);
  std::operator<<(poVar4,(string *)psVar1);
  for (uVar5 = 0; uVar5 < pScene->mNumMeshes; uVar5 = uVar5 + 1) {
    paVar2 = pScene->mMeshes[uVar5];
    if (paVar2 != (aiMesh *)0x0) {
      lVar7 = 8;
      for (uVar6 = 0; uVar6 < paVar2->mNumVertices; uVar6 = uVar6 + 1) {
        paVar3 = paVar2->mVertices;
        poVar4 = std::operator<<((ostream *)this,"  vertex ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -8));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -4));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)&paVar3->x + lVar7));
        std::operator<<(poVar4,(string *)psVar1);
        poVar4 = std::operator<<((ostream *)this,"  vertex ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -8));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -4));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)&paVar3->x + lVar7));
        std::operator<<(poVar4,(string *)psVar1);
        poVar4 = std::operator<<((ostream *)this,"  vertex ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -8));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)paVar3 + lVar7 + -4));
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)((long)&paVar3->x + lVar7));
        std::operator<<(poVar4,(string *)psVar1);
        lVar7 = lVar7 + 0xc;
      }
    }
  }
  poVar4 = std::operator<<((ostream *)this,"endsolid");
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,(string *)name);
  std::operator<<(poVar4,(string *)psVar1);
  return;
}

Assistant:

void STLExporter::WritePointCloud(const std::string &name, const aiScene* pScene) {
    mOutput << " " << SolidToken << " " << name << endl;
    aiVector3D nor;
    mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh *mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {
            const aiVector3D& v = mesh->mVertices[a];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }
    }
    mOutput << EndSolidToken << " " << name << endl;
}